

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_bzip2.c
# Opt level: O1

void test_write_filter_bzip2(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  void *pvVar4;
  void *__s;
  archive *paVar5;
  char *pcVar6;
  ssize_t sVar7;
  int64_t iVar8;
  longlong lVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  archive_entry *ae;
  size_t used2;
  size_t used1;
  char path [16];
  archive_entry *local_78;
  void *local_70;
  uint local_68;
  undefined4 uStack_64;
  void *local_60;
  ulong local_58;
  uint local_50;
  undefined4 uStack_4c;
  char local_48 [24];
  
  pvVar4 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                   ,L'/',(uint)(pvVar4 != (void *)0x0),"NULL != (buff = (char *)malloc(buffsize))",
                   (void *)0x0);
  if (pvVar4 != (void *)0x0) {
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                     ,L'4',(uint)(__s != (void *)0x0),"NULL != (data = (char *)malloc(datasize))",
                     (void *)0x0);
    if (__s != (void *)0x0) {
      uVar10 = 0;
      memset(__s,0,10000);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                       ,L'>',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                          ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      wVar2 = archive_write_add_filter_bzip2(paVar5);
      if (wVar2 == L'\xffffffec') {
        wVar3 = canBzip2();
        uVar10 = (ulong)(wVar3 != L'\0');
      }
      if (wVar2 == L'\0' || uVar10 != 0) {
        local_58 = uVar10;
        iVar1 = archive_write_set_bytes_per_block(paVar5,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'K',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar5);
        iVar1 = archive_filter_code(paVar5,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'L',2,"ARCHIVE_FILTER_BZIP2",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar6 = archive_filter_name(paVar5,0);
        local_60 = __s;
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                   ,L'M',"bzip2","\"bzip2\"",pcVar6,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        local_70 = pvVar4;
        iVar1 = archive_write_open_memory(paVar5,pvVar4,2000000,(size_t *)&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'O',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar5);
        iVar1 = archive_filter_code(paVar5,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'P',2,"ARCHIVE_FILTER_BZIP2",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar6 = archive_filter_name(paVar5,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                   ,L'Q',"bzip2","\"bzip2\"",pcVar6,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        local_78 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'R',(uint)(local_78 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype(local_78,0x8000);
        archive_entry_set_size(local_78,10000);
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          archive_entry_copy_pathname(local_78,local_48);
          iVar1 = archive_write_header(paVar5,local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5)
          ;
          sVar7 = archive_write_data(paVar5,local_60,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                           ,L'Z',(uint)(sVar7 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar5);
          uVar12 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar12;
        } while (uVar12 != 999);
        archive_entry_free(local_78);
        iVar1 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L']',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
        iVar1 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar5 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'`',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar5);
        iVar1 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            paVar5);
        iVar1 = archive_read_open_memory(paVar5,local_70,CONCAT44(uStack_4c,local_50));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'd',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used1)",paVar5);
        uVar12 = 0;
        do {
          sprintf(local_48,"file%03d",(ulong)uVar12);
          iVar1 = archive_read_next_header(paVar5,&local_78);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                                      ,L'g',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",
                                      (void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(local_78);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                     ,L'i',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          iVar8 = archive_entry_size(local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'j',10000,"(int)datasize",iVar8,"archive_entry_size(ae)",(void *)0x0
                             );
          uVar12 = uVar12 + 1;
        } while (uVar12 != 999);
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
        iVar1 = archive_read_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar5 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L's',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar5);
        iVar1 = archive_write_set_bytes_per_block(paVar5,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'v',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar5);
        wVar2 = archive_write_add_filter_bzip2(paVar5);
        if ((char)local_58 == '\0') {
          pcVar6 = "ARCHIVE_OK";
          wVar3 = L'|';
          lVar9 = 0;
        }
        else {
          pcVar6 = "ARCHIVE_WARN";
          wVar3 = L'y';
          lVar9 = -0x14;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,wVar3,lVar9,pcVar6,(long)wVar2,"archive_write_add_filter_bzip2(a)",
                            paVar5);
        pvVar4 = local_70;
        iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"nonexistent-option","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'~',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")"
                            ,paVar5);
        iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","abc");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x80',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                            ,paVar5);
        iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","99");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x82',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")"
                            ,paVar5);
        iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","9");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")"
                            ,paVar5);
        iVar1 = archive_write_open_memory(paVar5,pvVar4,2000000,(size_t *)&local_68);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
        pvVar4 = local_60;
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          local_78 = archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                           ,L'\x89',(uint)(local_78 != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname(local_78,local_48);
          archive_entry_set_size(local_78,10000);
          archive_entry_set_filetype(local_78,0x8000);
          iVar1 = archive_write_header(paVar5,local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",
                              paVar5);
          sVar7 = archive_write_data(paVar5,pvVar4,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                           ,L'\x8f',(uint)(sVar7 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar5);
          archive_entry_free(local_78);
          uVar12 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar12;
        } while (uVar12 != 999);
        iVar1 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
        iVar1 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0)
        ;
        paVar5 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'\x9d',(uint)(paVar5 != (archive *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar1 = archive_read_support_format_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x9e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)"
                            ,paVar5);
        iVar1 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'\x9f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)"
                            ,paVar5);
        iVar1 = archive_read_open_memory(paVar5,local_70,CONCAT44(uStack_64,local_68));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'¡',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used2)",paVar5);
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          iVar1 = archive_read_next_header(paVar5,&local_78);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                                      ,L'¤',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",
                                      (void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(local_78);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                     ,L'¦',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          iVar8 = archive_entry_size(local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'§',10000,"(int)datasize",iVar8,"archive_entry_size(ae)",
                              (void *)0x0);
          uVar12 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar12;
        } while (uVar12 != 999);
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'©',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
        iVar1 = archive_read_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ª',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar5 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'¯',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'°',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar5);
        iVar1 = archive_write_set_bytes_per_block(paVar5,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'²',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar5);
        wVar2 = archive_write_add_filter_bzip2(paVar5);
        if ((char)local_58 == '\0') {
          pcVar6 = "ARCHIVE_OK";
          wVar3 = L'¸';
          lVar9 = 0;
        }
        else {
          pcVar6 = "ARCHIVE_WARN";
          wVar3 = L'µ';
          lVar9 = -0x14;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,wVar3,lVar9,pcVar6,(long)wVar2,"archive_write_add_filter_bzip2(a)",
                            paVar5);
        pvVar4 = local_70;
        iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'º',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")"
                            ,paVar5);
        iVar1 = archive_write_open_memory(paVar5,pvVar4,2000000,(size_t *)&local_68);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'¼',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
        pvVar4 = local_60;
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          local_78 = archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                           ,L'¿',(uint)(local_78 != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname(local_78,local_48);
          archive_entry_set_size(local_78,10000);
          archive_entry_set_filetype(local_78,0x8000);
          iVar1 = archive_write_header(paVar5,local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5
                             );
          failure("Writing file %s",local_48);
          sVar7 = archive_write_data(paVar5,pvVar4,10000);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'Æ',10000,"datasize",sVar7,
                              "(size_t)archive_write_data(a, data, datasize)",paVar5);
          archive_entry_free(local_78);
          uVar12 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar12;
        } while (uVar12 != 999);
        iVar1 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
        iVar1 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",(ulong)local_68,
                (ulong)local_50);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'Ï',(uint)(CONCAT44(uStack_4c,local_50) < CONCAT44(uStack_64,local_68)),
                         "used2 > used1",(void *)0x0);
        paVar5 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'Ñ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Ò',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar5);
        iVar1 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Ó',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            paVar5);
        iVar1 = archive_read_open_memory(paVar5,local_70,CONCAT44(uStack_64,local_68));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Õ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used2)",paVar5);
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          iVar1 = archive_read_next_header(paVar5,&local_78);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                                      ,L'Ø',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",
                                      (void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(local_78);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                     ,L'Ú',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          iVar8 = archive_entry_size(local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                              ,L'Û',10000,"(int)datasize",iVar8,"archive_entry_size(ae)",
                              (void *)0x0);
          uVar12 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar12;
        } while (uVar12 != 999);
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Ý',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
        iVar1 = archive_read_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Þ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar5 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'ä',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        wVar2 = archive_write_add_filter_bzip2(paVar5);
        cVar11 = (char)local_58;
        if (cVar11 == '\0') {
          pcVar6 = "ARCHIVE_OK";
          wVar3 = L'ê';
          lVar9 = 0;
        }
        else {
          pcVar6 = "ARCHIVE_WARN";
          wVar3 = L'ç';
          lVar9 = -0x14;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,wVar3,lVar9,pcVar6,(long)wVar2,"archive_write_add_filter_bzip2(a)",
                            paVar5);
        __s = local_70;
        iVar1 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ë',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar5 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'í',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        wVar2 = archive_write_add_filter_bzip2(paVar5);
        if (cVar11 == '\0') {
          pcVar6 = "ARCHIVE_OK";
          wVar3 = L'ó';
          lVar9 = 0;
        }
        else {
          pcVar6 = "ARCHIVE_WARN";
          wVar3 = L'ð';
          lVar9 = -0x14;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,wVar3,lVar9,pcVar6,(long)wVar2,"archive_write_add_filter_bzip2(a)",
                            paVar5);
        iVar1 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ô',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        iVar1 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'õ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar5 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'÷',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ø',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar5);
        wVar2 = archive_write_add_filter_bzip2(paVar5);
        if (cVar11 == '\0') {
          pcVar6 = "ARCHIVE_OK";
          wVar3 = L'þ';
          lVar9 = 0;
        }
        else {
          pcVar6 = "ARCHIVE_WARN";
          wVar3 = L'û';
          lVar9 = -0x14;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,wVar3,lVar9,pcVar6,(long)wVar2,"archive_write_add_filter_bzip2(a)",
                            paVar5);
        iVar1 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ÿ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        iVar1 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Ā',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar5 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                         ,L'Ă',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ă',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar5);
        wVar2 = archive_write_add_filter_bzip2(paVar5);
        if (cVar11 == '\0') {
          pcVar6 = "ARCHIVE_OK";
          wVar3 = L'ĉ';
          lVar9 = 0;
        }
        else {
          pcVar6 = "ARCHIVE_WARN";
          wVar3 = L'Ć';
          lVar9 = -0x14;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,wVar3,lVar9,pcVar6,(long)wVar2,"archive_write_add_filter_bzip2(a)",
                            paVar5);
        iVar1 = archive_write_open_memory(paVar5,__s,2000000,(size_t *)&local_68);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'ċ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
        iVar1 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                            ,L'Č',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        wVar2 = L'č';
        pvVar4 = local_60;
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                       ,L'C');
        test_skipping("bzip2 writing not supported on this platform");
        wVar2 = L'D';
      }
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                          ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(pvVar4);
      pvVar4 = __s;
    }
    free(pvVar4);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_bzip2)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_bzip2(a);
	use_prog = (r == ARCHIVE_WARN && canBzip2());
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("bzip2 writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_BZIP2, archive_filter_code(a, 0));
	assertEqualString("bzip2", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_BZIP2, archive_filter_code(a, 0));
	assertEqualString("bzip2", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_set_filter_option(a,
	    NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_set_filter_option(a,
	    NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_set_filter_option(a,
	    NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_filter_option(a,
	    NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data,
		    datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Curiously, this test fails; the test data above compresses
	 * better at default compression than at level 9. */
	/*
	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_filter_option(a,
	    NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Level 0 really does result in larger data. */
	failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}